

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::Encoder::Encoder(Encoder *this)

{
  long in_RDI;
  EncoderPacketWindow *in_stack_fffffffffffffff0;
  
  pktalloc::Allocator::Allocator((Allocator *)in_stack_fffffffffffffff0);
  EncoderStats::EncoderStats((EncoderStats *)(in_RDI + 0x1c8));
  EncoderPacketWindow::EncoderPacketWindow(in_stack_fffffffffffffff0);
  EncoderAcknowledgementState::EncoderAcknowledgementState((EncoderAcknowledgementState *)0x1dbba4);
  GrowingAlignedDataBuffer::GrowingAlignedDataBuffer((GrowingAlignedDataBuffer *)(in_RDI + 0x6c8));
  *(undefined4 *)(in_RDI + 0x6d8) = 0;
  *(undefined4 *)(in_RDI + 0x6dc) = 0;
  *(undefined4 *)(in_RDI + 0x6e0) = 0;
  *(long *)(in_RDI + 0x210) = in_RDI;
  *(long *)(in_RDI + 0x218) = in_RDI + 0x1c8;
  *(long *)(in_RDI + 0x650) = in_RDI;
  *(long *)(in_RDI + 0x658) = in_RDI + 0x210;
  return;
}

Assistant:

Encoder::Encoder()
{
    Window.TheAllocator = &TheAllocator;
    Window.Stats        = &Stats;
    Ack.TheAllocator    = &TheAllocator;
    Ack.TheWindow       = &Window;
}